

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthreads_summator_lib.cpp
# Opt level: O2

longlong more_pthr(void)

{
  int *piVar1;
  int *__arg;
  long lVar2;
  pthread_t *__newthread;
  long lVar3;
  undefined1 auStack_80 [8];
  pthread_t threads [10];
  
  __newthread = threads;
  auStack_80 = (undefined1  [8])0x1027b5;
  piVar1 = (int *)operator_new__(0xa0);
  __arg = piVar1;
  for (lVar2 = -10; lVar2 != 0; lVar2 = lVar2 + 1) {
    *__arg = (int)lVar2 + 0xb;
    __arg[2] = 0;
    __arg[3] = 0;
    auStack_80 = (undefined1  [8])0x1027ec;
    pthread_create(__newthread,(pthread_attr_t *)0x0,thread,__arg);
    __newthread = __newthread + 1;
    __arg = __arg + 4;
  }
  lVar3 = 0;
  for (lVar2 = 4; lVar2 != 0x54; lVar2 = lVar2 + 8) {
    auStack_80 = (undefined1  [8])0x102812;
    pthread_join(*(pthread_t *)((long)threads + lVar2 + -4),(void **)0x0);
    lVar3 = lVar3 + *(long *)((long)piVar1 + lVar2 * 2);
  }
  auStack_80 = (undefined1  [8])0x102821;
  clock();
  auStack_80 = (undefined1  [8])0x102829;
  operator_delete__(piVar1);
  return lVar3;
}

Assistant:

long long more_pthr() {
    pthread_t threads[N];
    thr_data* threadData = new thr_data[N];
    long long all_sum = 0;
    for(int i = 0; i < N; i++){
        threadData[i].numberFile = i + 1;
        threadData[i].sum = 0;
        pthread_create(&(threads[i]), NULL, thread, &threadData[i]);
    }
    for(int i = 0; i < N; i++){
        pthread_join(threads[i], NULL);
        all_sum+=threadData[i].sum;
    }
    unsigned int time_end = clock();
    delete[] threadData;
    return all_sum;
}